

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_Mesh::Transform(ON_Mesh *this,ON_Xform *xform)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  ON_MeshCurvatureStats *this_00;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  float *vector;
  ON_SurfaceCurvature *pOVar12;
  ON_BoundingBox *in_R8;
  long lVar13;
  int j;
  bool bVar14;
  ON_BoundingBox transformed_bbox;
  ON_BoundingBox bbox;
  ON_BoundingBox local_e8;
  ON_BoundingBox local_b0 [2];
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  iVar10 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  bVar14 = iVar10 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (!bVar14) {
    ON_Geometry::BoundingBox(local_b0,&this->super_ON_Geometry);
    local_e8.m_max.y = local_b0[0].m_max.y;
    local_e8.m_max.z = local_b0[0].m_max.z;
    local_e8.m_min.z = local_b0[0].m_min.z;
    local_e8.m_max.x = local_b0[0].m_max.x;
    local_e8.m_min.x = local_b0[0].m_min.x;
    local_e8.m_min.y = local_b0[0].m_min.y;
    ON_BoundingBox::Transform(&local_e8,xform);
    bVar14 = ON_BeyondSinglePrecision(local_b0,(ON_Xform *)0x0);
    if (!bVar14) {
      bVar14 = false;
      bVar9 = ON_BeyondSinglePrecision(&local_e8,(ON_Xform *)0x0);
      if (!bVar9) goto LAB_005046fc;
    }
    UpdateDoublePrecisionVertices(this);
    bVar14 = iVar10 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
  }
LAB_005046fc:
  if ((!bVar14) && (-1 < (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
    (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count = 0;
  }
  if (bVar14) {
    bVar14 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
    in_R8 = (ON_BoundingBox *)
            ON_3dPoint::operator[]((this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a,0);
    ON_TransformPointList(3,false,iVar10,3,(double *)in_R8,xform);
  }
  else {
    bVar14 = false;
  }
  dVar4 = ON_Xform::Determinant(xform,(double *)0x0);
  if (bVar14 == false) {
    in_R8 = (ON_BoundingBox *)
            ON_3fPoint::operator[]((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a,0);
    bVar14 = ON_TransformPointList(3,false,iVar10,3,(float *)in_R8,xform);
  }
  else {
    UpdateSinglePrecisionVertices(this);
    bVar14 = true;
  }
  if (bVar14 != false) {
    ON_MappingTag::Transform(&this->m_Ctag,xform);
    ON_MappingTag::Transform(&this->m_Ttag,xform);
    lVar11 = (long)(this->m_TC).m_count;
    if (0 < lVar11) {
      lVar13 = 0;
      do {
        ON_MappingTag::Transform
                  ((ON_MappingTag *)((((this->m_TC).m_a)->m_tag).m_mapping_id.Data4 + lVar13 + -8),
                   xform);
        lVar13 = lVar13 + 0xb8;
      } while (lVar11 * 0xb8 - lVar13 != 0);
    }
  }
  if (((dVar4 != 0.0) || (NAN(dVar4))) || (bVar14 == false)) {
    if (bVar14 != false) {
      iVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      if ((0 < iVar3) && ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar3)) {
        in_R8 = local_b0;
        ON_Xform::ON_Xform((ON_Xform *)in_R8);
        dVar2 = ON_Xform::GetSurfaceNormalXform(xform,(ON_Xform *)in_R8);
        vector = ON_3fVector::operator[]((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a,0);
        bVar14 = ON_TransformVectorList(3,iVar10,3,vector,(ON_Xform *)in_R8);
        if (dVar2 < 0.0) {
          FlipVertexNormals(this);
        }
        UnitizeVertexNormals(this);
      }
      if (bVar14 != false) goto LAB_005048b0;
    }
  }
  else {
    iVar10 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    if ((iVar10 < 1) || ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count != iVar10)) {
LAB_005048b0:
      iVar10 = (this->m_F).m_count;
      if ((0 < iVar10) && ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar10)) {
        ComputeFaceNormals(this);
      }
    }
    else {
      ComputeFaceNormals(this);
      ComputeVertexNormals(this);
    }
  }
  if ((((bVar14 != false) &&
       (iVar10 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar10)) &&
      ((this->m_K).m_count == iVar10)) && (1.490116119385e-08 < ABS(ABS(dVar4) + -1.0))) {
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      dVar2 = xform->m_xform[0][0];
      if (((dVar2 != 0.0) || (NAN(dVar2))) && (dVar2 == xform->m_xform[1][1])) {
        pdVar1 = xform->m_xform[2] + 2;
        if (((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) &&
           (ABS(dVar4 - dVar2 * dVar2 * dVar2) <= dVar4 * 1.490116119385e-08)) {
          iVar10 = (this->m_K).m_count;
          if (iVar10 != 0) {
            pOVar12 = (this->m_K).m_a;
            do {
              pOVar12->k1 = pOVar12->k1 * (1.0 / dVar2);
              pOVar12->k2 = pOVar12->k2 * (1.0 / dVar2);
              pOVar12 = pOVar12 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar11 = 0;
          do {
            this_00 = this->m_kstat[lVar11];
            if (this_00 != (ON_MeshCurvatureStats *)0x0) {
              ON_MeshCurvatureStats::Set
                        (this_00,this_00->m_style,(this->m_K).m_count,(this->m_K).m_a,
                         (ON_3fVector *)in_R8,0.0);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          goto LAB_00504a0b;
        }
      }
    }
    bVar14 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0xbe6,"","ON_Mesh::Transform() cannot apply this transform to curvatures.\n");
  }
LAB_00504a0b:
  dVar8 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
  dVar7 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
  dVar6 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
  dVar5 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
  dVar2 = ON_BoundingBox::UnsetBoundingBox.m_min.x;
  (this->m_vertex_bbox).m_max.y = ON_BoundingBox::UnsetBoundingBox.m_max.y;
  (this->m_vertex_bbox).m_max.z = dVar8;
  (this->m_vertex_bbox).m_min.z = dVar6;
  (this->m_vertex_bbox).m_max.x = dVar7;
  (this->m_vertex_bbox).m_min.x = dVar2;
  (this->m_vertex_bbox).m_min.y = dVar5;
  ON_BoundingBoxCache::RemoveAllBoundingBoxes(&this->m_tight_bbox_cache);
  *(undefined8 *)(this->m_nbox[0] + 2) = 0xbf8000003f800000;
  *(float *)((long)(this->m_nbox + 0) + 0) = 1.0;
  *(float *)((long)(this->m_nbox + 0) + 4) = 1.0;
  *(float *)((long)(this->m_nbox + 1) + 4) = -1.0;
  *(float *)((long)(this->m_nbox + 1) + 8) = -1.0;
  if (ABS(dVar4) <= 2.3283064365386963e-10) {
    ON_MeshTopology::Destroy(&this->m_top);
  }
  return bVar14;
}

Assistant:

bool ON_Mesh::Transform( 
       const ON_Xform& xform
       )
{
  // Transform user data before doing sanity checks in case rogue code
  // damages m_V[], m_dV[] or other data members.
  TransformUserData(xform);
	DestroyTree();

  const unsigned int vertex_count = VertexUnsignedCount();

  const bool bIsValid_fV = (vertex_count == m_V.UnsignedCount());
  if (false == bIsValid_fV)
    m_V.SetCount(0);

  bool bIsValid_dV = (vertex_count == m_dV.UnsignedCount());

  // 2 Jan 2020 S. Baer (RH-54464)
  // If the transform is moving the mesh into or out of "beyond single precision",
  // set up double precision vertices in order to get our best possible precision
  // after the transform.
  if (false == bIsValid_dV)
  {
    ON_BoundingBox bbox = BoundingBox();
    ON_BoundingBox transformed_bbox = bbox;
    transformed_bbox.Transform(xform);
    if (ON_BeyondSinglePrecision(bbox, nullptr) || ON_BeyondSinglePrecision(transformed_bbox, nullptr))
    {
      UpdateDoublePrecisionVertices();
      bIsValid_dV = (vertex_count == m_dV.UnsignedCount());
    }
  }


  if (false == bIsValid_dV)
    m_dV.SetCount(0);

  const bool bSyncheddV = bIsValid_fV && bIsValid_dV && HasSynchronizedDoubleAndSinglePrecisionVertices();

  if (bIsValid_dV)
    ON_TransformPointList(3, false, vertex_count, 3, &m_dV[0][0], xform);
  
  double d = xform.Determinant();
  bool rc = false;
  if ( bSyncheddV )
  {
    // transforming the double precision vertices is the 
    // best way to set the floats.
    UpdateSinglePrecisionVertices();
    rc = true;
  }
  else if ( bIsValid_fV )
  {
    rc = ON_TransformPointList( 3, false, vertex_count, 3, &m_V[0][0], xform );
  }

  if ( rc )
  {
    m_Ctag.Transform(xform);
    m_Ttag.Transform(xform);
    int tci, tccnt = m_TC.Count();
    for ( tci = 0; tci < tccnt; tci++ )
    {
      m_TC[tci].m_tag.Transform(xform);
    }
  }

  if ( rc && 0.0 == d )
  {
    // mesh has been squashed to a plane (or worse)
    if ( HasVertexNormals() )
    {
      ComputeFaceNormals();
      ComputeVertexNormals();
    }
    else if ( HasFaceNormals() )
    {
      ComputeFaceNormals();
    }
  }
  else if ( rc )
  {
    if ( HasVertexNormals() ) 
    {
      // See http://www.gignews.com/realtime020100.htm or these
      // references.
      //
      // 1. Hanrahan, Pat, 
      //    "A Survey of Ray-Surface Intersection Algorithms", 
      //     chapter 3 in Andrew Glassner (editor), 
      //     An Introduction to Ray Tracing, 
      //     Academic Press Inc., London, 1989.
      //
      // 2. Turkowski, Ken, 
      //    "Properties of Surface-Normal Transformations", 
      //     in Andrew Glassner (editor), 
      //     Graphics Gems, Academic Press, Inc., 
      //     pp. 539-547, 1990. 
      ON_Xform N_xform;
      const double det = xform.GetSurfaceNormalXform(N_xform);
      rc = ON_TransformVectorList( 3, vertex_count, 3, &m_N[0][0], N_xform )?true:false;
      if ( det < 0.0 )
      {
        FlipVertexNormals();
      }
      UnitizeVertexNormals();
    }

    if ( rc && HasFaceNormals() ) 
    {
      ComputeFaceNormals();
    }
  }

  if ( rc && HasPrincipalCurvatures() ) 
  {
    if ( fabs(fabs(d) - 1.0) > ON_SQRT_EPSILON ) 
    {
      // If it's a uniform scale, handle it, otherwise we can't do it.
      double scale = xform.m_xform[0][0];
      if ( 0.0 != scale && 0.0 != d
           && scale == xform.m_xform[1][1] 
           && scale == xform.m_xform[2][2] 
           && fabs(d - scale*scale*scale) <= d*ON_SQRT_EPSILON )
      {
        // uniform scale
        const double ks = 1.0/scale;
        ON_SurfaceCurvature* sc = m_K.Array();
        int ki = m_K.Count();
        while ( ki-- )
        {
          sc->k1 *= ks;
          sc->k2 *= ks;
          sc++;
        }

        // update curvature stats.
        for ( int j = 0; j < 4; j++ )
        {
          if ( m_kstat[j] )
            m_kstat[j]->Set( m_kstat[j]->m_style,m_K.Count(),m_K.Array(),m_N.Array() );
        }
      }
      else
      {
        ON_ERROR("ON_Mesh::Transform() cannot apply this transform to curvatures.\n");
        rc = false;
      }
    }
  }

  InvalidateVertexBoundingBox();
  InvalidateVertexNormalBoundingBox();
  if ( fabs(d) <= ON_ZERO_TOLERANCE )
    DestroyTopology(); // transform may not be one-to-one on vertices

  return rc;
}